

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListView::setRowHidden(QListView *this,int row,bool hide)

{
  QListViewPrivate *this_00;
  bool bVar1;
  long lVar2;
  
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  bVar1 = QListViewPrivate::isHidden(this_00,row);
  lVar2 = 0x88;
  if ((hide && !bVar1) || (lVar2 = 0x90, bVar1 && !hide)) {
    (**(code **)((long)this_00->commonListView->_vptr_QCommonListViewBase + lVar2))();
  }
  QAbstractItemViewPrivate::doDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate,0);
  QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  viewport);
  return;
}

Assistant:

void QListView::setRowHidden(int row, bool hide)
{
    Q_D(QListView);
    const bool hidden = d->isHidden(row);
    if (hide && !hidden)
        d->commonListView->appendHiddenRow(row);
    else if (!hide && hidden)
        d->commonListView->removeHiddenRow(row);
    d->doDelayedItemsLayout();
    d->viewport->update();
}